

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

bool __thiscall
wasm::ValidationInfo::shouldBeFalse<wasm::StructGet*>
          (ValidationInfo *this,bool result,StructGet *curr,char *text,Function *func)

{
  undefined7 in_register_00000031;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  allocator<char> local_31;
  
  if ((int)CONCAT71(in_register_00000031,result) != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,text,&local_31);
    std::operator+(&local_58,"unexpected true: ",&local_78);
    fail<wasm::StructGet*,std::__cxx11::string>(this,&local_58,curr,func);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return !result;
}

Assistant:

bool shouldBeFalse(bool result,
                     T curr,
                     const char* text,
                     Function* func = nullptr) {
    if (result) {
      fail("unexpected true: " + std::string(text), curr, func);
      return false;
    }
    return true;
  }